

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::TensorValue::clear_value(TensorValue *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  TensorValue_RepeatedStrings *this_00;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).floats_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedFloats::~TensorValue_RepeatedFloats((TensorValue_RepeatedFloats *)this_00);
    break;
  case 2:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).ints_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedInts::~TensorValue_RepeatedInts((TensorValue_RepeatedInts *)this_00);
    break;
  case 3:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).bools_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedBools::~TensorValue_RepeatedBools((TensorValue_RepeatedBools *)this_00);
    break;
  case 4:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (this->value_).strings_, this_00 == (TensorValue_RepeatedStrings *)0x0))
    goto switchD_00230c0f_default;
    TensorValue_RepeatedStrings::~TensorValue_RepeatedStrings(this_00);
    uVar2 = 0x30;
    goto LAB_00230d4a;
  case 5:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).longints_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts
              ((TensorValue_RepeatedLongInts *)this_00);
    break;
  case 6:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).doubles_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedDoubles::~TensorValue_RepeatedDoubles
              ((TensorValue_RepeatedDoubles *)this_00);
    break;
  case 7:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (TensorValue_RepeatedStrings *)(this->value_).bytes_,
       this_00 == (TensorValue_RepeatedStrings *)0x0)) goto switchD_00230c0f_default;
    TensorValue_RepeatedBytes::~TensorValue_RepeatedBytes((TensorValue_RepeatedBytes *)this_00);
    uVar2 = 0x20;
    goto LAB_00230d4a;
  default:
    goto switchD_00230c0f_default;
  }
  uVar2 = 0x28;
LAB_00230d4a:
  operator_delete(this_00,uVar2);
switchD_00230c0f_default:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TensorValue::clear_value() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.MILSpec.TensorValue)
  switch (value_case()) {
    case kFloats: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.floats_;
      }
      break;
    }
    case kInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.ints_;
      }
      break;
    }
    case kBools: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bools_;
      }
      break;
    }
    case kStrings: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.strings_;
      }
      break;
    }
    case kLongInts: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.longints_;
      }
      break;
    }
    case kDoubles: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.doubles_;
      }
      break;
    }
    case kBytes: {
      if (GetArenaForAllocation() == nullptr) {
        delete value_.bytes_;
      }
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = VALUE_NOT_SET;
}